

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualMemory.c
# Opt level: O3

_Bool sysbvm_virtualMemory_lockCodePagesForWriting
                (void *writePointer,void *executablePointer,size_t size)

{
  int iVar1;
  _Bool _Var2;
  ulong uVar3;
  void *__addr;
  
  _Var2 = true;
  if (writePointer == executablePointer) {
    iVar1 = getpagesize();
    uVar3 = -(long)iVar1;
    __addr = (void *)(uVar3 & (ulong)writePointer);
    pthread_mutex_lock((pthread_mutex_t *)&codeZoneWriteLock);
    iVar1 = mprotect(__addr,((long)writePointer + (long)iVar1 + size + -1 & uVar3) - (long)__addr,7)
    ;
    if (iVar1 != 0) {
      pthread_mutex_unlock((pthread_mutex_t *)&codeZoneWriteLock);
      _Var2 = false;
    }
  }
  return _Var2;
}

Assistant:

bool sysbvm_virtualMemory_lockCodePagesForWriting(void *writePointer, void *executablePointer, size_t size)
{
    if(writePointer != executablePointer)
        return true;

    size_t pageAlignment = sysbvm_virtualMemory_getSystemAllocationAlignment();
    uintptr_t startAddress = (uintptr_t)executablePointer & (-pageAlignment);
    uintptr_t endAddress = ((uintptr_t)executablePointer + size + pageAlignment - 1) & (-pageAlignment);

    pthread_mutex_lock(&codeZoneWriteLock);
    bool success = mprotect((void*)startAddress, endAddress - startAddress, PROT_READ | PROT_WRITE | PROT_EXEC) == 0;
    if(!success)
        pthread_mutex_unlock(&codeZoneWriteLock);

    return success;
}